

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O2

size_t mi_page_usable_aligned_size_of(mi_page_t *page,void *p)

{
  mi_block_t *pmVar1;
  
  pmVar1 = _mi_page_ptr_unalign(page,p);
  return (long)pmVar1 + (page->block_size - (long)p);
}

Assistant:

static size_t mi_decl_noinline mi_page_usable_aligned_size_of(const mi_page_t* page, const void* p) mi_attr_noexcept {
  const mi_block_t* block = _mi_page_ptr_unalign(page, p);
  const size_t size = mi_page_usable_size_of(page, block);
  const ptrdiff_t adjust = (uint8_t*)p - (uint8_t*)block;
  mi_assert_internal(adjust >= 0 && (size_t)adjust <= size);
  const size_t aligned_size = (size - adjust);
  #if MI_GUARDED
  if (mi_block_ptr_is_guarded(block, p)) {
    return aligned_size - _mi_os_page_size();
  }
  #endif
  return aligned_size;
}